

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqfuncstate.cpp
# Opt level: O1

SQInteger __thiscall
SQFuncState::PushLocalVariable(SQFuncState *this,SQObject *name,bool assignable)

{
  SQUnsignedInteger *pSVar1;
  uint uVar2;
  uint uVar3;
  SQLocalVarInfo *pSVar4;
  SQLocalVarInfo *pSVar5;
  ulong uVar6;
  SQLocalVarInfo lvi;
  SQObjectPtr local_38;
  ulong local_28;
  uint local_20;
  bool local_1c;
  
  uVar2 = (this->_vlocals)._size;
  local_38.super_SQObject._type = name->_type;
  local_38.super_SQObject._flags = name->_flags;
  local_38.super_SQObject._5_3_ = *(undefined3 *)&name->field_0x5;
  local_38.super_SQObject._unVal = (SQObjectValue)(name->_unVal).pTable;
  if ((local_38.super_SQObject._0_8_ & 0x8000000) != 0) {
    pSVar1 = &((local_38.super_SQObject._unVal.pTable)->super_SQDelegable).super_SQCollectable.
              super_SQRefCounted._uiRef;
    *pSVar1 = *pSVar1 + 1;
  }
  local_28 = (ulong)(this->_instructions)._size;
  local_20 = (this->_vlocals)._size;
  uVar3 = (this->_vlocals)._allocated;
  local_1c = assignable;
  if (uVar3 <= local_20) {
    uVar6 = 4;
    if (local_20 * 2 != 0) {
      uVar6 = (ulong)(local_20 * 2);
    }
    pSVar5 = (SQLocalVarInfo *)
             sq_vm_realloc((this->_vlocals)._alloc_ctx,(this->_vlocals)._vals,(ulong)uVar3 << 5,
                           uVar6 << 5);
    (this->_vlocals)._vals = pSVar5;
    (this->_vlocals)._allocated = (size_type)uVar6;
  }
  pSVar4 = (this->_vlocals)._vals;
  uVar3 = (this->_vlocals)._size;
  (this->_vlocals)._size = uVar3 + 1;
  pSVar5 = pSVar4 + uVar3;
  (pSVar5->_name).super_SQObject._type = 0;
  (pSVar5->_name).super_SQObject._flags = '\0';
  *(undefined3 *)&(pSVar5->_name).super_SQObject.field_0x5 = 0;
  (pSVar5->_name).super_SQObject._unVal.pTable = (SQTable *)0x0;
  pSVar4[uVar3]._name.super_SQObject._type = OT_NULL;
  pSVar5 = pSVar4 + uVar3;
  (pSVar5->_name).super_SQObject._type = local_38.super_SQObject._type;
  (pSVar5->_name).super_SQObject._flags = local_38.super_SQObject._flags;
  *(undefined3 *)&(pSVar5->_name).super_SQObject.field_0x5 = local_38.super_SQObject._5_3_;
  (pSVar5->_name).super_SQObject._unVal.pTable = (SQTable *)local_38.super_SQObject._unVal;
  if ((pSVar4[uVar3]._name.super_SQObject._type & 0x8000000) != 0) {
    pSVar1 = &((pSVar4[uVar3]._name.super_SQObject._unVal.pTable)->super_SQDelegable).
              super_SQCollectable.super_SQRefCounted._uiRef;
    *pSVar1 = *pSVar1 + 1;
  }
  pSVar4[uVar3]._start_op = (undefined4)local_28;
  pSVar4[uVar3]._end_op = local_28._4_4_;
  pSVar4[uVar3]._pos = local_20;
  pSVar4[uVar3]._assignable = local_1c;
  uVar6 = (ulong)(this->_vlocals)._size;
  if ((ulong)this->_stacksize < uVar6) {
    this->_stacksize = uVar6;
  }
  SQObjectPtr::~SQObjectPtr(&local_38);
  return (ulong)uVar2;
}

Assistant:

SQInteger SQFuncState::PushLocalVariable(const SQObject &name, bool assignable)
{
    SQInteger pos=_vlocals.size();
    SQLocalVarInfo lvi;
    lvi._name=name;
    lvi._start_op=GetCurrentPos()+1;
    lvi._pos=_vlocals.size();
    lvi._assignable=assignable;
    _vlocals.push_back(lvi);
    if(_vlocals.size()>((SQUnsignedInteger)_stacksize))_stacksize=_vlocals.size();
    return pos;
}